

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

void __thiscall cmCTestRunTest::ComputeArguments(cmCTestRunTest *this)

{
  cmCTest *pcVar1;
  ostream *poVar2;
  cmCTestTestProperties *pcVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pbVar5;
  value_type *__x;
  char *local_1e8 [4];
  string testCommand;
  ostringstream cmCTestLog_msg;
  
  this_00 = &this->Arguments;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  pbVar5 = (this->TestProperties->Args).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (this->TestHandler->MemCheck == true) {
    __x = pbVar5 + 1;
    std::__cxx11::string::assign((char *)&this->ActualCommand);
    cmCTestTestHandler::FindTheExecutable_abi_cxx11_
              ((string *)&cmCTestLog_msg,this->TestHandler,
               (this->TestProperties->Args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    std::__cxx11::string::operator=
              ((string *)
               ((this->TestProperties->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1),(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    pcVar4 = extraout_RDX;
  }
  else {
    cmCTestTestHandler::FindTheExecutable_abi_cxx11_
              ((string *)&cmCTestLog_msg,this->TestHandler,pbVar5[1]._M_dataplus._M_p);
    std::__cxx11::string::operator=((string *)&this->ActualCommand,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    __x = pbVar5 + 2;
    pcVar4 = extraout_RDX_00;
  }
  cmSystemTools::ConvertToOutputPath_abi_cxx11_
            (&testCommand,(cmSystemTools *)(this->ActualCommand)._M_dataplus._M_p,pcVar4);
  (*(this->TestHandler->super_cmCTestGenericHandler).super_cmObject._vptr_cmObject[10])
            (this->TestHandler,this_00,(ulong)(uint)this->Index);
  for (pbVar5 = (this->Arguments).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 != (this->Arguments).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
    std::__cxx11::string::append((char *)&testCommand);
    std::__cxx11::string::append((string *)&testCommand);
    std::__cxx11::string::append((char *)&testCommand);
  }
  for (; __x != (this->TestProperties->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    std::__cxx11::string::append((char *)&testCommand);
    std::__cxx11::string::append((string *)&testCommand);
    std::__cxx11::string::append((char *)&testCommand);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,__x);
  }
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).FullCommandLine);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&cmCTestLog_msg);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->Index);
  poVar2 = std::operator<<(poVar2,": ");
  pcVar4 = "Test";
  if (this->TestHandler->MemCheck != false) {
    pcVar4 = "MemCheck";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2," command: ");
  poVar2 = std::operator<<(poVar2,(string *)&testCommand);
  std::endl<char,std::char_traits<char>>(poVar2);
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x248,local_1e8[0],false);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  pcVar3 = this->TestProperties;
  pbVar5 = (pcVar3->Environment).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pcVar3->Environment).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = (ostream *)std::ostream::operator<<(&cmCTestLog_msg,this->Index);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,"Environment variables: ");
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x24e,local_1e8[0],false);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    pcVar3 = this->TestProperties;
    pbVar5 = (pcVar3->Environment).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; pbVar5 != (pcVar3->Environment).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = (ostream *)std::ostream::operator<<((ostringstream *)&cmCTestLog_msg,this->Index);
    poVar2 = std::operator<<(poVar2,":  ");
    poVar2 = std::operator<<(poVar2,(string *)pbVar5);
    std::endl<char,std::char_traits<char>>(poVar2);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x255,local_1e8[0],false);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    pcVar3 = this->TestProperties;
  }
  std::__cxx11::string::~string((string *)&testCommand);
  return;
}

Assistant:

void cmCTestRunTest::ComputeArguments()
{
  this->Arguments.clear(); // reset becaue this might be a rerun
  std::vector<std::string>::const_iterator j =
    this->TestProperties->Args.begin();
  ++j; // skip test name
  // find the test executable
  if(this->TestHandler->MemCheck)
    {
    cmCTestMemCheckHandler * handler = static_cast<cmCTestMemCheckHandler*>
      (this->TestHandler);
    this->ActualCommand = handler->MemoryTester.c_str();
    this->TestProperties->Args[1] = this->TestHandler->FindTheExecutable(
      this->TestProperties->Args[1].c_str());
    }
  else
    {
    this->ActualCommand =
      this->TestHandler->FindTheExecutable(
      this->TestProperties->Args[1].c_str());
    ++j; //skip the executable (it will be actualCommand)
    }
  std::string testCommand
    = cmSystemTools::ConvertToOutputPath(this->ActualCommand.c_str());

  //Prepends memcheck args to our command string
  this->TestHandler->GenerateTestCommand(this->Arguments, this->Index);
  for(std::vector<std::string>::iterator i = this->Arguments.begin();
      i != this->Arguments.end(); ++i)
    {
    testCommand += " \"";
    testCommand += *i;
    testCommand += "\"";
    }

  for(;j != this->TestProperties->Args.end(); ++j)
    {
    testCommand += " \"";
    testCommand += *j;
    testCommand += "\"";
    this->Arguments.push_back(*j);
    }
  this->TestResult.FullCommandLine = testCommand;

  // Print the test command in verbose mode
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl
             << this->Index << ": "
             << (this->TestHandler->MemCheck?"MemCheck":"Test")
             << " command: " << testCommand
             << std::endl);

  // Print any test-specific env vars in verbose mode
  if (this->TestProperties->Environment.size())
    {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->Index << ": "
               << "Environment variables: " << std::endl);
    }
  for(std::vector<std::string>::const_iterator e =
      this->TestProperties->Environment.begin();
      e != this->TestProperties->Environment.end(); ++e)
    {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->Index << ":  " << *e
               << std::endl);
    }
}